

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# coleitr.cpp
# Opt level: O1

void __thiscall
icu_63::CollationElementIterator::CollationElementIterator
          (CollationElementIterator *this,CharacterIterator *source,RuleBasedCollator *coll,
          UErrorCode *status)

{
  (this->super_UObject)._vptr_UObject = (_func_int **)&PTR__CollationElementIterator_003f1c20;
  this->iter_ = (CollationIterator *)0x0;
  this->rbc_ = coll;
  this->otherHalf_ = 0;
  this->dir_ = '\0';
  this->offsets_ = (UVector32 *)0x0;
  (this->string_).super_Replaceable.super_UObject._vptr_UObject =
       (_func_int **)&PTR__UnicodeString_00401be0;
  (this->string_).fUnion.fStackFields.fLengthAndFlags = 2;
  if (*status < U_ILLEGAL_ARGUMENT_ERROR) {
    (*(source->super_ForwardCharacterIterator).super_UObject._vptr_UObject[0x1a])
              (source,&this->string_);
    setText(this,&this->string_,status);
  }
  return;
}

Assistant:

CollationElementIterator::CollationElementIterator(
                                           const CharacterIterator &source,
                                           const RuleBasedCollator *coll,
                                           UErrorCode &status)
        : iter_(NULL), rbc_(coll), otherHalf_(0), dir_(0), offsets_(NULL) {
    // We only call source.getText() which should be const anyway.
    setText(const_cast<CharacterIterator &>(source), status);
}